

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O0

void sqlcheck::ValidateColorMode(Configuration *state)

{
  undefined8 uVar1;
  bool *in_RDX;
  string local_30;
  Configuration *local_10;
  Configuration *state_local;
  
  local_10 = state;
  GetBooleanString_abi_cxx11_(&local_30,(sqlcheck *)state,in_RDX);
  uVar1 = std::__cxx11::string::c_str();
  printf("> %s :: %s\n","COLOR MODE   ",uVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ValidateColorMode(const Configuration &state) {
    printf("> %s :: %s\n", "COLOR MODE   ",
           GetBooleanString(state.color_mode).c_str());
}